

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateFlagInlineCacheCheckForGetterSetter
          (Lowerer *this,Instr *insertBeforeInstr,RegOpnd *opndInlineCache,LabelInstr *labelNext)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  IndirOpnd *testSrc1;
  IntConstOpnd *testSrc2;
  Opnd *accessorOpnd;
  Opnd *flagsOpnd;
  uint accessorFlagMask;
  LabelInstr *labelNext_local;
  RegOpnd *opndInlineCache_local;
  Instr *insertBeforeInstr_local;
  Lowerer *this_local;
  
  uVar2 = Func::GetSourceContextId(insertBeforeInstr->m_func);
  uVar3 = Func::GetLocalFunctionId(insertBeforeInstr->m_func);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlineGettersPhase,uVar2,uVar3);
  if (bVar1) {
    flagsOpnd._4_4_ = Js::InlineCache::GetSetterFlagMask();
  }
  else {
    uVar2 = Func::GetSourceContextId(insertBeforeInstr->m_func);
    uVar3 = Func::GetLocalFunctionId(insertBeforeInstr->m_func);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlineSettersPhase,uVar2,uVar3);
    if (bVar1) {
      flagsOpnd._4_4_ = Js::InlineCache::GetGetterFlagMask();
    }
    else {
      flagsOpnd._4_4_ = Js::InlineCache::GetGetterSetterFlagMask();
    }
  }
  testSrc1 = IR::IndirOpnd::New(opndInlineCache,8,TyInt8,insertBeforeInstr->m_func,false);
  testSrc2 = IR::IntConstOpnd::New((ulong)flagsOpnd._4_4_,TyInt8,this->m_func,false);
  InsertTestBranch(&testSrc1->super_Opnd,&testSrc2->super_Opnd,BrEq_A,labelNext,insertBeforeInstr);
  return;
}

Assistant:

void
Lowerer::GenerateFlagInlineCacheCheckForGetterSetter(
    IR::Instr * insertBeforeInstr,
    IR::RegOpnd * opndInlineCache,
    IR::LabelInstr * labelNext)
{
    uint accessorFlagMask;
    if (PHASE_OFF(Js::InlineGettersPhase, insertBeforeInstr->m_func))
    {
        accessorFlagMask = Js::InlineCache::GetSetterFlagMask();
    }
    else if (PHASE_OFF(Js::InlineSettersPhase, insertBeforeInstr->m_func))
    {
        accessorFlagMask = Js::InlineCache::GetGetterFlagMask();
    }
    else
    {
        accessorFlagMask = Js::InlineCache::GetGetterSetterFlagMask();
    }

    // Generate:
    //
    //      TEST [&(inlineCache->u.accessor.flags)], Js::InlineCacheGetterFlag | Js::InlineCacheSetterFlag
    //      JEQ $next

    IR::Opnd * flagsOpnd = IR::IndirOpnd::New(opndInlineCache, (int32)offsetof(Js::InlineCache, u.accessor.rawUInt16), TyInt8, insertBeforeInstr->m_func);
    IR::Opnd * accessorOpnd = IR::IntConstOpnd::New(accessorFlagMask, TyInt8, this->m_func);
    InsertTestBranch(flagsOpnd, accessorOpnd, Js::OpCode::BrEq_A, labelNext, insertBeforeInstr);
}